

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downcast.cpp
# Opt level: O2

void C_A_T_C_H_T_E_S_T_0(void)

{
  bool bVar1;
  AssertionHandler *pAVar2;
  AssertionHandler catchAssertionHandler_242;
  Section local_1790;
  AssertionHandler catchAssertionHandler;
  int normal;
  undefined4 uStack_1574;
  size_type local_1570;
  SourceLineInfo local_1548 [2];
  int_t i;
  SourceLineInfo *local_1520;
  int local_1514;
  istringstream in;
  StringRef local_1390;
  StringRef local_1380;
  StringRef local_1370;
  StringRef local_1360;
  StringRef local_1350;
  StringRef local_1340;
  StringRef local_1330;
  StringRef local_1320;
  StringRef local_1310;
  StringRef local_1300;
  StringRef local_12f0;
  StringRef local_12e0;
  StringRef local_12d0;
  StringRef local_12c0;
  StringRef local_12b0;
  StringRef local_12a0;
  StringRef local_1290;
  StringRef local_1280;
  StringRef local_1270;
  StringRef local_1260;
  StringRef local_1250;
  StringRef local_1240;
  StringRef local_1230;
  StringRef local_1220;
  StringRef local_1210;
  StringRef local_1200;
  StringRef local_11f0;
  StringRef local_11e0;
  StringRef local_11d0;
  StringRef local_11c0;
  StringRef local_11b0;
  StringRef local_11a0;
  StringRef local_1190;
  StringRef local_1180;
  StringRef local_1170;
  StringRef local_1160;
  StringRef local_1150;
  StringRef local_1140;
  StringRef local_1130;
  StringRef local_1120;
  StringRef local_1110;
  StringRef local_1100;
  StringRef local_10f0;
  StringRef local_10e0;
  StringRef local_10d0;
  StringRef local_10c0;
  StringRef local_10b0;
  StringRef local_10a0;
  StringRef local_1090;
  StringRef local_1080;
  StringRef local_1070;
  StringRef local_1060;
  StringRef local_1050;
  StringRef local_1040;
  StringRef local_1030;
  StringRef local_1020;
  StringRef local_1010;
  StringRef local_1000;
  StringRef local_ff0;
  StringRef local_fe0;
  StringRef local_fd0;
  StringRef local_fc0;
  StringRef local_fb0;
  StringRef local_fa0;
  StringRef local_f90;
  StringRef local_f80;
  StringRef local_f70;
  StringRef local_f60;
  StringRef local_f50;
  StringRef local_f40;
  StringRef local_f30;
  StringRef local_f20;
  StringRef local_f10;
  StringRef local_f00;
  StringRef local_ef0;
  StringRef local_ee0;
  StringRef local_ed0;
  StringRef local_ec0;
  StringRef local_eb0;
  StringRef local_ea0;
  StringRef local_e90;
  StringRef local_e80;
  StringRef local_e70;
  StringRef local_e60;
  StringRef local_e50;
  StringRef local_e40;
  StringRef local_e30;
  StringRef local_e20;
  StringRef local_e10;
  StringRef local_e00;
  StringRef local_df0;
  StringRef local_de0;
  StringRef local_dd0;
  StringRef local_dc0;
  StringRef local_db0;
  StringRef local_da0;
  StringRef local_d90;
  StringRef local_d80;
  StringRef local_d70;
  StringRef local_d60;
  StringRef local_d50;
  StringRef local_d40;
  StringRef local_d30;
  StringRef local_d20;
  StringRef local_d10;
  StringRef local_d00;
  StringRef local_cf0;
  StringRef local_ce0;
  StringRef local_cd0;
  StringRef local_cc0;
  StringRef local_cb0;
  StringRef local_ca0;
  StringRef local_c90;
  StringRef local_c80;
  StringRef local_c70;
  StringRef local_c60;
  StringRef local_c50;
  StringRef local_c40;
  StringRef local_c30;
  StringRef local_c20;
  StringRef local_c10;
  StringRef local_c00;
  StringRef local_bf0;
  StringRef local_be0;
  StringRef local_bd0;
  StringRef local_bc0;
  StringRef local_bb0;
  StringRef local_ba0;
  StringRef local_b90;
  StringRef local_b80;
  StringRef local_b70;
  StringRef local_b60;
  StringRef local_b50;
  StringRef local_b40;
  StringRef local_b30;
  StringRef local_b20;
  StringRef local_b10;
  StringRef local_b00;
  StringRef local_af0;
  StringRef local_ae0;
  StringRef local_ad0;
  StringRef local_ac0;
  StringRef local_ab0;
  StringRef local_aa0;
  StringRef local_a90;
  StringRef local_a80;
  StringRef local_a70;
  StringRef local_a60;
  StringRef local_a50;
  StringRef local_a40;
  StringRef local_a30;
  StringRef local_a20;
  StringRef local_a10;
  StringRef local_a00;
  StringRef local_9f0;
  StringRef local_9e0;
  StringRef local_9d0;
  StringRef local_9c0;
  StringRef local_9b0;
  StringRef local_9a0;
  StringRef local_990;
  StringRef local_980;
  StringRef local_970;
  StringRef local_960;
  StringRef local_950;
  StringRef local_940;
  StringRef local_930;
  StringRef local_920;
  StringRef local_910;
  StringRef local_900;
  StringRef local_8f0;
  StringRef local_8e0;
  StringRef local_8d0;
  StringRef local_8c0;
  StringRef local_8b0;
  StringRef local_8a0;
  StringRef local_890;
  StringRef local_880;
  StringRef local_870;
  StringRef local_860;
  StringRef local_850;
  StringRef local_840;
  StringRef local_830;
  StringRef local_820;
  StringRef local_810;
  StringRef local_800;
  StringRef local_7f0;
  StringRef local_7e0;
  StringRef local_7d0;
  StringRef local_7c0;
  StringRef local_7b0;
  StringRef local_7a0;
  StringRef local_790;
  StringRef local_780;
  StringRef local_770;
  StringRef local_760;
  StringRef local_750;
  StringRef local_740;
  StringRef local_730;
  StringRef local_720;
  StringRef local_710;
  StringRef local_700;
  StringRef local_6f0;
  StringRef local_6e0;
  StringRef local_6d0;
  StringRef local_6c0;
  StringRef local_6b0;
  StringRef local_6a0;
  StringRef local_690;
  StringRef local_680;
  StringRef local_670;
  StringRef local_660;
  StringRef local_650;
  StringRef local_640;
  StringRef local_630;
  StringRef local_620;
  StringRef local_610;
  StringRef local_600;
  StringRef local_5f0;
  StringRef local_5e0;
  StringRef local_5d0;
  StringRef local_5c0;
  StringRef local_5b0;
  StringRef local_5a0;
  StringRef local_590;
  StringRef local_580;
  StringRef local_570;
  StringRef local_560;
  StringRef local_550;
  StringRef local_540;
  StringRef local_530;
  StringRef local_520;
  StringRef local_510;
  StringRef local_500;
  StringRef local_4f0;
  StringRef local_4e0;
  StringRef local_4d0;
  StringRef local_4c0;
  StringRef local_4b0;
  StringRef local_4a0;
  StringRef local_490;
  StringRef local_480;
  StringRef local_470;
  StringRef local_460;
  StringRef local_450;
  StringRef local_440;
  StringRef local_430;
  StringRef local_420;
  StringRef local_410;
  StringRef local_400;
  StringRef local_3f0;
  StringRef local_3e0;
  StringRef local_3d0;
  StringRef local_3c0;
  StringRef local_3b0;
  StringRef local_3a0;
  StringRef local_390;
  StringRef local_380;
  StringRef local_370;
  StringRef local_360;
  StringRef local_350;
  StringRef local_340;
  StringRef local_330;
  StringRef local_320;
  StringRef local_310;
  StringRef local_300;
  StringRef local_2f0;
  StringRef local_2e0;
  StringRef local_2d0;
  StringRef local_2c0;
  StringRef local_2b0;
  StringRef local_2a0;
  StringRef local_290;
  StringRef local_280;
  StringRef local_270;
  StringRef local_260;
  StringRef local_250;
  StringRef local_240;
  StringRef local_230;
  StringRef local_220;
  StringRef local_210;
  StringRef local_200;
  StringRef local_1f0;
  StringRef local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  StringRef local_1b0;
  StringRef local_1a0;
  StringRef local_190;
  StringRef local_180;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x30;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"constructor",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x33;
    Catch::StringRef::StringRef(&local_40,"static_cast<int>(a) == 0");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_40,Normal);
    normal = 0;
    local_1548[0].file._0_4_ = 0;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x35;
    Catch::StringRef::StringRef(&local_50,"static_cast<int>(b) == 32");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_50,Normal);
    normal = 0x20;
    local_1548[0].file._0_4_ = 0x20;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x37;
    Catch::StringRef::StringRef(&local_60,"static_cast<int>(c) == -25");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_60,Normal);
    _normal = (char *)CONCAT44(uStack_1574,0xffffffe7);
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0xffffffe7);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x39;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"assignment",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x3d;
    Catch::StringRef::StringRef(&local_70,"static_cast<int>(a) == 32");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_70,Normal);
    normal = 0x20;
    local_1548[0].file._0_4_ = 0x20;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x3f;
    Catch::StringRef::StringRef(&local_80,"static_cast<int>(a) == -25");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_80,Normal);
    _normal = (char *)CONCAT44(uStack_1574,0xffffffe7);
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0xffffffe7);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x41;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"unary",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x44;
    Catch::StringRef::StringRef(&local_90,"static_cast<int>(+a) == static_cast<int>(a)");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_90,Normal);
    normal = 0xd;
    local_1548[0].file._0_4_ = 0xd;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x45;
    Catch::StringRef::StringRef(&local_a0,"static_cast<int>(-a) == -static_cast<int>(a)");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_a0,Normal);
    bVar1 = type_safe::detail::will_multiplication_error<int>(0xd,0xffffffffffffffff);
    pAVar2 = &catchAssertionHandler_242;
    if (bVar1) goto LAB_0017846b;
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0xfffffff3);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(catchAssertionHandler_242.m_assertionInfo.macroName.m_start._4_4_,
                          0xfffffff3);
    _normal = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,(ExprLhs<int_const&> *)&normal,
               (int *)&catchAssertionHandler_242);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x47;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"increment",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x4a;
    Catch::StringRef::StringRef(&local_b0,"static_cast<int>(++a) == 1");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_b0,Normal);
    normal = 1;
    local_1548[0].file._0_4_ = 1;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x4b;
    Catch::StringRef::StringRef(&local_c0,"static_cast<int>(a++) == 1");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_c0,Normal);
    normal = 1;
    local_1548[0].file._0_4_ = 1;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x4c;
    Catch::StringRef::StringRef(&local_d0,"static_cast<int>(a) == 2");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_d0,Normal);
    _normal = (char *)CONCAT44(uStack_1574,2);
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,2);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x4e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"decrement",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x51;
    Catch::StringRef::StringRef(&local_e0,"static_cast<int>(--a) == -1");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_e0,Normal);
    normal = -1;
    local_1548[0].file._0_4_ = 0xffffffff;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x52;
    Catch::StringRef::StringRef(&local_f0,"static_cast<int>(a--) == -1");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_f0,Normal);
    normal = -1;
    local_1548[0].file._0_4_ = 0xffffffff;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x53;
    Catch::StringRef::StringRef(&local_100,"static_cast<int>(a) == -2");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_100,Normal);
    _normal = (char *)CONCAT44(uStack_1574,0xfffffffe);
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0xfffffffe);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x55;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"addition",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    _normal = (char *)((ulong)_normal & 0xffffffff00000000);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x59;
    Catch::StringRef::StringRef(&local_110,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_110,Normal);
    local_1548[0].file = (char *)((ulong)local_1548[0].file & 0xffffffff00000000);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x5d;
    normal = normal + 5;
    Catch::StringRef::StringRef(&local_120,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_120,Normal);
    local_1548[0].file._0_4_ = 5;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    normal = normal + 5;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x61;
    Catch::StringRef::StringRef(&local_130,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_130,Normal);
    local_1548[0].file._0_4_ = 10;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    normal = normal + -0x17;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x65;
    Catch::StringRef::StringRef(&local_140,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_140,Normal);
    local_1548[0].file._0_4_ = 0xfffffff3;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    normal = normal + 0x16;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x69;
    Catch::StringRef::StringRef(&local_150,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_150,Normal);
    local_1548[0].file._0_4_ = 9;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    _normal = (char *)CONCAT44(uStack_1574,normal + -4);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x6d;
    Catch::StringRef::StringRef(&local_160,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_160,Normal);
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,5);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x6f;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"subtraction",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (bVar1) {
    _normal = (char *)((ulong)_normal & 0xffffffff00000000);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x73;
    Catch::StringRef::StringRef(&local_170,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_170,Normal);
    local_1548[0].file = (char *)((ulong)local_1548[0].file & 0xffffffff00000000);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x77;
    normal = normal + -5;
    Catch::StringRef::StringRef(&local_180,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_180,Normal);
    local_1548[0].file._0_4_ = 0xfffffffb;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    normal = normal + -5;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x7b;
    Catch::StringRef::StringRef(&local_190,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_190,Normal);
    local_1548[0].file._0_4_ = 0xfffffff6;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    normal = normal + 0x17;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x7f;
    Catch::StringRef::StringRef(&local_1a0,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_1a0,Normal);
    local_1548[0].file._0_4_ = 0xd;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    normal = 0x16 - normal;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x83;
    Catch::StringRef::StringRef(&local_1b0,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_1b0,Normal);
    local_1548[0].file._0_4_ = 9;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    _normal = (char *)CONCAT44(uStack_1574,-4 - normal);
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x87;
    Catch::StringRef::StringRef(&local_1c0,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_1c0,Normal);
    local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0xfffffff3);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  Catch::Section::~Section((Section *)&in);
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x89;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1790,"multiplication",(allocator<char> *)&normal);
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
             (string *)&local_1790);
  Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
  Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1790);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
  if (!bVar1) {
LAB_0016ec47:
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xa3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"division",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      normal = 0x23f;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xa7;
      Catch::StringRef::StringRef(&local_230,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_230,Normal);
      local_1548[0].file._0_4_ = 0x23f;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = normal / 5;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xab;
      Catch::StringRef::StringRef(&local_240,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_240,Normal);
      local_1548[0].file._0_4_ = 0x73;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = normal / 5;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xaf;
      Catch::StringRef::StringRef(&local_250,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_250,Normal);
      local_1548[0].file._0_4_ = 0x17;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = normal / -0x17;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xb3;
      Catch::StringRef::StringRef(&local_260,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_260,Normal);
      local_1548[0].file._0_4_ = 0xffffffff;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = (int)(0x16 / (long)normal);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xb7;
      Catch::StringRef::StringRef(&local_270,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_270,Normal);
      local_1548[0].file._0_4_ = 0xffffffea;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      _normal = (char *)CONCAT44(uStack_1574,(int)(-4 / (long)normal));
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xbb;
      Catch::StringRef::StringRef(&local_280,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_280,Normal);
      local_1548[0].file = (char *)((ulong)local_1548[0].file._4_4_ << 0x20);
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xbd;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"modulo",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      normal = 0x90;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xc1;
      Catch::StringRef::StringRef(&local_290,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_290,Normal);
      local_1548[0].file._0_4_ = 0x90;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = normal % 5;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xc5;
      Catch::StringRef::StringRef(&local_2a0,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_2a0,Normal);
      local_1548[0].file._0_4_ = 4;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = normal % 5;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xc9;
      Catch::StringRef::StringRef(&local_2b0,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_2b0,Normal);
      local_1548[0].file._0_4_ = 4;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = normal % 0x17;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xcd;
      Catch::StringRef::StringRef(&local_2c0,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_2c0,Normal);
      local_1548[0].file._0_4_ = 4;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      normal = (int)(0x16 % (long)normal);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xd1;
      Catch::StringRef::StringRef(&local_2d0,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_2d0,Normal);
      local_1548[0].file._0_4_ = 2;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      _normal = (char *)CONCAT44(uStack_1574,(int)(-4 % (long)normal));
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xd5;
      Catch::StringRef::StringRef(&local_2e0,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_2e0,Normal);
      local_1548[0].file = (char *)((ulong)local_1548[0].file._4_4_ << 0x20);
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xd7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"comparison",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xdc;
      Catch::StringRef::StringRef(&local_2f0,"bool(int_t(4) == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_2f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xdd;
      Catch::StringRef::StringRef(&local_300,"!(int_t(5) == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_300,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xde;
      Catch::StringRef::StringRef(&local_310,"bool(uint_t(4u) == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_310,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xdf;
      Catch::StringRef::StringRef(&local_320,"!(uint_t(5u) == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_320,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe0;
      Catch::StringRef::StringRef(&local_330,"!(uint_t(u32_max) == int_t(-1))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_330,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe1;
      Catch::StringRef::StringRef(&local_340,"bool(int_t(4) == uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_340,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe2;
      Catch::StringRef::StringRef(&local_350,"!(int_t(5) == uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_350,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe3;
      Catch::StringRef::StringRef(&local_360,"!(int_t(-1) == uint_t(u32_max))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_360,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe5;
      Catch::StringRef::StringRef(&local_370,"bool(4 == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_370,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe6;
      Catch::StringRef::StringRef(&local_380,"!(5 == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_380,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe7;
      Catch::StringRef::StringRef(&local_390,"bool(4u == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_390,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe8;
      Catch::StringRef::StringRef(&local_3a0,"!(5u == int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_3a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xe9;
      Catch::StringRef::StringRef(&local_3b0,"!(u32_max == int_t(-1))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_3b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xea;
      Catch::StringRef::StringRef(&local_3c0,"bool(4 == uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_3c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xeb;
      Catch::StringRef::StringRef(&local_3d0,"!(5 == uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_3d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xec;
      Catch::StringRef::StringRef(&local_3e0,"!(-1 == uint_t(u32_max))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_3e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xee;
      Catch::StringRef::StringRef(&local_3f0,"bool(int_t(4) == 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_3f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xef;
      Catch::StringRef::StringRef(&local_400,"!(int_t(5) == 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_400,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf0;
      Catch::StringRef::StringRef(&local_410,"bool(int_t(4) == 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_410,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf1;
      Catch::StringRef::StringRef(&local_420,"!(int_t(5) == 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_420,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf2;
      Catch::StringRef::StringRef(&local_430,"!(int_t(-1) == u32_max)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_430,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf3;
      Catch::StringRef::StringRef(&local_440,"bool(uint_t(4u) == 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_440,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf4;
      Catch::StringRef::StringRef(&local_450,"!(uint_t(5u) == 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_450,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf5;
      Catch::StringRef::StringRef(&local_460,"!(uint_t(u32_max) == -1)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_460,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf8;
      Catch::StringRef::StringRef(&local_470,"bool(int_t(5) != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_470,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xf9;
      Catch::StringRef::StringRef(&local_480,"!(int_t(4) != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_480,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xfa;
      Catch::StringRef::StringRef(&local_490,"bool(uint_t(5u) != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_490,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xfb;
      Catch::StringRef::StringRef(&local_4a0,"!(uint_t(4u) != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_4a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xfc;
      Catch::StringRef::StringRef(&local_4b0,"bool(uint_t(u32_max) != int_t(-1))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_4b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xfd;
      Catch::StringRef::StringRef(&local_4c0,"bool(int_t(5) != uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_4c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xfe;
      Catch::StringRef::StringRef(&local_4d0,"!(int_t(4) != uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_4d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xff;
      Catch::StringRef::StringRef(&local_4e0,"bool(int_t(-1) != uint_t(u32_max))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_4e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x101;
      Catch::StringRef::StringRef(&local_4f0,"bool(5 != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_4f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x102;
      Catch::StringRef::StringRef(&local_500,"!(4 != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_500,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x103;
      Catch::StringRef::StringRef(&local_510,"bool(5u != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_510,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x104;
      Catch::StringRef::StringRef(&local_520,"!(4u != int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_520,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x105;
      Catch::StringRef::StringRef(&local_530,"bool(u32_max != int_t(-1))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_530,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x106;
      Catch::StringRef::StringRef(&local_540,"bool(5 != uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_540,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x107;
      Catch::StringRef::StringRef(&local_550,"!(4 != uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_550,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x108;
      Catch::StringRef::StringRef(&local_560,"bool(-1 != uint_t(u32_max))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_560,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x10a;
      Catch::StringRef::StringRef(&local_570,"bool(int_t(5) != 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_570,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x10b;
      Catch::StringRef::StringRef(&local_580,"!(int_t(4) != 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_580,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x10c;
      Catch::StringRef::StringRef(&local_590,"bool(int_t(5) != 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_590,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x10d;
      Catch::StringRef::StringRef(&local_5a0,"!(int_t(4) != 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_5a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x10e;
      Catch::StringRef::StringRef(&local_5b0,"bool(int_t(-1) != u32_max)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_5b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x10f;
      Catch::StringRef::StringRef(&local_5c0,"bool(uint_t(5u) != 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_5c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x110;
      Catch::StringRef::StringRef(&local_5d0,"!(uint_t(4u) != 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_5d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x111;
      Catch::StringRef::StringRef(&local_5e0,"bool(uint_t(u32_max) != -1)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_5e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x114;
      Catch::StringRef::StringRef(&local_5f0,"bool(int_t(4) < int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_5f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x115;
      Catch::StringRef::StringRef(&local_600,"!(int_t(5) < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_600,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x116;
      Catch::StringRef::StringRef(&local_610,"!(int_t(4) < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_610,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x117;
      Catch::StringRef::StringRef(&local_620,"bool(uint_t(4u) < int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_620,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x118;
      Catch::StringRef::StringRef(&local_630,"!bool(uint_t(4u) < int_t(-5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_630,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x119;
      Catch::StringRef::StringRef(&local_640,"!(uint_t(5u) < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_640,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x11a;
      Catch::StringRef::StringRef(&local_650,"!(uint_t(4u) < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_650,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x11b;
      Catch::StringRef::StringRef(&local_660,"bool(int_t(4) < uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_660,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x11c;
      Catch::StringRef::StringRef(&local_670,"bool(int_t(-4) < uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_670,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x11d;
      Catch::StringRef::StringRef(&local_680,"!(int_t(5) < uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_680,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x11e;
      Catch::StringRef::StringRef(&local_690,"!(int_t(4) < uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_690,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x120;
      Catch::StringRef::StringRef(&local_6a0,"bool(4 < int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_6a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x121;
      Catch::StringRef::StringRef(&local_6b0,"!(5 < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_6b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x122;
      Catch::StringRef::StringRef(&local_6c0,"!(4 < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_6c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x123;
      Catch::StringRef::StringRef(&local_6d0,"bool(4u < int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_6d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x124;
      Catch::StringRef::StringRef(&local_6e0,"!bool(4u < int_t(-5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_6e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x125;
      Catch::StringRef::StringRef(&local_6f0,"!(5u < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_6f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x126;
      Catch::StringRef::StringRef(&local_700,"!(4u < int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_700,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x127;
      Catch::StringRef::StringRef(&local_710,"bool(4 < uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_710,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x128;
      Catch::StringRef::StringRef(&local_720,"bool(-4 < uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_720,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x129;
      Catch::StringRef::StringRef(&local_730,"!(5 < uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_730,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x12a;
      Catch::StringRef::StringRef(&local_740,"!(4 < uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_740,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 300;
      Catch::StringRef::StringRef(&local_750,"bool(int_t(4) < 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_750,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x12d;
      Catch::StringRef::StringRef(&local_760,"!(int_t(5) < 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_760,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x12e;
      Catch::StringRef::StringRef(&local_770,"!(int_t(4) < 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_770,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x12f;
      Catch::StringRef::StringRef(&local_780,"bool(int_t(4) < 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_780,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x130;
      Catch::StringRef::StringRef(&local_790,"!(int_t(5) < 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_790,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x131;
      Catch::StringRef::StringRef(&local_7a0,"(int_t(-5) < 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_7a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x132;
      Catch::StringRef::StringRef(&local_7b0,"!(int_t(4) < 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_7b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x133;
      Catch::StringRef::StringRef(&local_7c0,"bool(uint_t(4u) < 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_7c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x134;
      Catch::StringRef::StringRef(&local_7d0,"!bool(uint_t(4u) < -5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_7d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x135;
      Catch::StringRef::StringRef(&local_7e0,"!(uint_t(5u) < 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_7e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x136;
      Catch::StringRef::StringRef(&local_7f0,"!(uint_t(4u) < 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_7f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x139;
      Catch::StringRef::StringRef(&local_800,"bool(int_t(4) <= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_800,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x13a;
      Catch::StringRef::StringRef(&local_810,"!(int_t(5) <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_810,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x13b;
      Catch::StringRef::StringRef(&local_820,"bool(int_t(4) <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_820,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x13c;
      Catch::StringRef::StringRef(&local_830,"bool(uint_t(4u) <= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_830,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x13d;
      Catch::StringRef::StringRef(&local_840,"!(uint_t(4u) <= int_t(-5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_840,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x13e;
      Catch::StringRef::StringRef(&local_850,"!(uint_t(5u) <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_850,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x13f;
      Catch::StringRef::StringRef(&local_860,"bool(uint_t(4u) <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_860,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x140;
      Catch::StringRef::StringRef(&local_870,"bool(int_t(4) <= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_870,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x141;
      Catch::StringRef::StringRef(&local_880,"!(int_t(5) <= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_880,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x142;
      Catch::StringRef::StringRef(&local_890,"bool(int_t(-5) <= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_890,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x143;
      Catch::StringRef::StringRef(&local_8a0,"bool(int_t(4) <= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_8a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x145;
      Catch::StringRef::StringRef(&local_8b0,"bool(4 <= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_8b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x146;
      Catch::StringRef::StringRef(&local_8c0,"!(5 <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_8c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x147;
      Catch::StringRef::StringRef(&local_8d0,"bool(4 <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_8d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x148;
      Catch::StringRef::StringRef(&local_8e0,"bool(4u <= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_8e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x149;
      Catch::StringRef::StringRef(&local_8f0,"!(5u <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_8f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x14a;
      Catch::StringRef::StringRef(&local_900,"bool(4u <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_900,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x14b;
      Catch::StringRef::StringRef(&local_910,"bool(4 <= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_910,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x14c;
      Catch::StringRef::StringRef(&local_920,"!(5 <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_920,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x14d;
      Catch::StringRef::StringRef(&local_930,"bool(4 <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_930,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x14e;
      Catch::StringRef::StringRef(&local_940,"!(4 <= int_t(-4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_940,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x14f;
      Catch::StringRef::StringRef(&local_950,"bool(4u <= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_950,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x150;
      Catch::StringRef::StringRef(&local_960,"!(5u <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_960,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x151;
      Catch::StringRef::StringRef(&local_970,"bool(4u <= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_970,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x152;
      Catch::StringRef::StringRef(&local_980,"bool(4 <= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_980,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x153;
      Catch::StringRef::StringRef(&local_990,"!(5 <= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_990,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x154;
      Catch::StringRef::StringRef(&local_9a0,"bool(4 <= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_9a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x155;
      Catch::StringRef::StringRef(&local_9b0,"bool(-4 <= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_9b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x157;
      Catch::StringRef::StringRef(&local_9c0,"bool(int_t(4) <= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_9c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x158;
      Catch::StringRef::StringRef(&local_9d0,"!(int_t(5) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_9d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x159;
      Catch::StringRef::StringRef(&local_9e0,"bool(int_t(4) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_9e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x15a;
      Catch::StringRef::StringRef(&local_9f0,"bool(int_t(-4) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_9f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x15b;
      Catch::StringRef::StringRef(&local_a00,"bool(int_t(4) <= 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a00,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x15c;
      Catch::StringRef::StringRef(&local_a10,"!(int_t(5) <= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a10,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x15d;
      Catch::StringRef::StringRef(&local_a20,"bool(int_t(4) <= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a20,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x15e;
      Catch::StringRef::StringRef(&local_a30,"(int_t(4) <= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a30,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x15f;
      Catch::StringRef::StringRef(&local_a40,"!(int_t(5) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a40,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x160;
      Catch::StringRef::StringRef(&local_a50,"bool(int_t(4) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a50,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x161;
      Catch::StringRef::StringRef(&local_a60,"bool(uint_t(4u) <= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a60,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x162;
      Catch::StringRef::StringRef(&local_a70,"!(uint_t(5u) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a70,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x163;
      Catch::StringRef::StringRef(&local_a80,"bool(uint_t(4u) <= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a80,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x164;
      Catch::StringRef::StringRef(&local_a90,"!(uint_t(4u) <= -4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_a90,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x165;
      Catch::StringRef::StringRef(&local_aa0,"bool(int_t(4) <= 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_aa0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x166;
      Catch::StringRef::StringRef(&local_ab0,"!(int_t(5) <= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ab0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x167;
      Catch::StringRef::StringRef(&local_ac0,"bool(int_t(4) <= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ac0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x168;
      Catch::StringRef::StringRef(&local_ad0,"bool(int_t(-4) <= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ad0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x16b;
      Catch::StringRef::StringRef(&local_ae0,"bool(int_t(5) > int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ae0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x16c;
      Catch::StringRef::StringRef(&local_af0,"!(int_t(4) > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_af0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x16d;
      Catch::StringRef::StringRef(&local_b00,"!(int_t(5) > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b00,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x16e;
      Catch::StringRef::StringRef(&local_b10,"bool(uint_t(5u) > int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b10,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x16f;
      Catch::StringRef::StringRef(&local_b20,"bool(uint_t(5u) > int_t(-4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b20,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x170;
      Catch::StringRef::StringRef(&local_b30,"!(uint_t(4u) > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b30,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x171;
      Catch::StringRef::StringRef(&local_b40,"!(uint_t(5u) > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b40,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x172;
      Catch::StringRef::StringRef(&local_b50,"bool(int_t(5) > uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b50,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x173;
      Catch::StringRef::StringRef(&local_b60,"!(int_t(-5) > uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b60,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x174;
      Catch::StringRef::StringRef(&local_b70,"!(int_t(4) > uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b70,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x175;
      Catch::StringRef::StringRef(&local_b80,"!(int_t(5) > uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b80,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x177;
      Catch::StringRef::StringRef(&local_b90,"bool(5 > int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_b90,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x178;
      Catch::StringRef::StringRef(&local_ba0,"!(4 > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ba0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x179;
      Catch::StringRef::StringRef(&local_bb0,"!(5 > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_bb0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x17a;
      Catch::StringRef::StringRef(&local_bc0,"bool(5u > int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_bc0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x17b;
      Catch::StringRef::StringRef(&local_bd0,"!(4u > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_bd0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x17c;
      Catch::StringRef::StringRef(&local_be0,"!(5u > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_be0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x17d;
      Catch::StringRef::StringRef(&local_bf0,"bool(5u > int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_bf0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x17e;
      Catch::StringRef::StringRef(&local_c00,"bool(5u > int_t(-4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c00,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x17f;
      Catch::StringRef::StringRef(&local_c10,"!(4u > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c10,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x180;
      Catch::StringRef::StringRef(&local_c20,"!(5u > int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c20,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x181;
      Catch::StringRef::StringRef(&local_c30,"bool(5 > uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c30,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x182;
      Catch::StringRef::StringRef(&local_c40,"!(-5 > uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c40,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x183;
      Catch::StringRef::StringRef(&local_c50,"!(4 > uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c50,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x184;
      Catch::StringRef::StringRef(&local_c60,"!(5 > uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c60,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x186;
      Catch::StringRef::StringRef(&local_c70,"bool(int_t(5) > 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c70,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x187;
      Catch::StringRef::StringRef(&local_c80,"!(int_t(4) > 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c80,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x188;
      Catch::StringRef::StringRef(&local_c90,"!(int_t(5) > 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_c90,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x189;
      Catch::StringRef::StringRef(&local_ca0,"bool(uint_t(5u) > 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ca0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x18a;
      Catch::StringRef::StringRef(&local_cb0,"bool(uint_t(5u) > -4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_cb0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x18b;
      Catch::StringRef::StringRef(&local_cc0,"!(uint_t(4u) > 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_cc0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x18c;
      Catch::StringRef::StringRef(&local_cd0,"!(uint_t(5u) > 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_cd0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x18d;
      Catch::StringRef::StringRef(&local_ce0,"bool(int_t(5) > 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ce0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x18e;
      Catch::StringRef::StringRef(&local_cf0,"!(int_t(-5) > 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_cf0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 399;
      Catch::StringRef::StringRef(&local_d00,"!(int_t(4) > 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d00,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 400;
      Catch::StringRef::StringRef(&local_d10,"!(int_t(5) > 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d10,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x193;
      Catch::StringRef::StringRef(&local_d20,"bool(int_t(5) >= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d20,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x194;
      Catch::StringRef::StringRef(&local_d30,"!(int_t(4) >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d30,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x195;
      Catch::StringRef::StringRef(&local_d40,"bool(int_t(5) >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d40,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x196;
      Catch::StringRef::StringRef(&local_d50,"bool(uint_t(5u) >= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d50,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x197;
      Catch::StringRef::StringRef(&local_d60,"!(uint_t(4u) >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d60,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x198;
      Catch::StringRef::StringRef(&local_d70,"bool(uint_t(4u) >= int_t(-5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d70,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x199;
      Catch::StringRef::StringRef(&local_d80,"bool(uint_t(5u) >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d80,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x19a;
      Catch::StringRef::StringRef(&local_d90,"bool(int_t(5) >= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_d90,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x19b;
      Catch::StringRef::StringRef(&local_da0,"!(int_t(4) >= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_da0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x19c;
      Catch::StringRef::StringRef(&local_db0,"bool(int_t(5) >= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_db0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x19d;
      Catch::StringRef::StringRef(&local_dc0,"!(int_t(-5) >= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_dc0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x19f;
      Catch::StringRef::StringRef(&local_dd0,"bool(5 >= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_dd0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a0;
      Catch::StringRef::StringRef(&local_de0,"!(4 >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_de0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a1;
      Catch::StringRef::StringRef(&local_df0,"bool(5 >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_df0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a2;
      Catch::StringRef::StringRef(&local_e00,"bool(5u >= int_t(4))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e00,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a3;
      Catch::StringRef::StringRef(&local_e10,"!(4u >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e10,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a4;
      Catch::StringRef::StringRef(&local_e20,"bool(4u >= int_t(-5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e20,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a5;
      Catch::StringRef::StringRef(&local_e30,"bool(5u >= int_t(5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e30,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a6;
      Catch::StringRef::StringRef(&local_e40,"bool(5u >= int_t(-5))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e40,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a7;
      Catch::StringRef::StringRef(&local_e50,"bool(5 >= uint_t(4u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e50,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a8;
      Catch::StringRef::StringRef(&local_e60,"!(4 >= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e60,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1a9;
      Catch::StringRef::StringRef(&local_e70,"bool(5 >= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e70,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1aa;
      Catch::StringRef::StringRef(&local_e80,"!(-5 >= uint_t(5u))");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e80,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ac;
      Catch::StringRef::StringRef(&local_e90,"bool(int_t(5) >= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_e90,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ad;
      Catch::StringRef::StringRef(&local_ea0,"!(int_t(4) >= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ea0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ae;
      Catch::StringRef::StringRef(&local_eb0,"bool(int_t(5) >= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_eb0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1af;
      Catch::StringRef::StringRef(&local_ec0,"bool(uint_t(5u) >= 4)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ec0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b0;
      Catch::StringRef::StringRef(&local_ed0,"!(uint_t(4u) >= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ed0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b1;
      Catch::StringRef::StringRef(&local_ee0,"bool(uint_t(4u) >= -5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ee0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b2;
      Catch::StringRef::StringRef(&local_ef0,"bool(uint_t(5u) >= 5)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ef0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b3;
      Catch::StringRef::StringRef(&local_f00,"bool(int_t(5) >= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f00,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b4;
      Catch::StringRef::StringRef(&local_f10,"!(int_t(-5) >= 4u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f10,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b5;
      Catch::StringRef::StringRef(&local_f20,"!(int_t(4) >= 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f20,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b6;
      Catch::StringRef::StringRef(&local_f30,"bool(int_t(5) >= 5u)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f30,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1b8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"make_(un)signed",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1bc;
      Catch::StringRef::StringRef(&local_f40,"static_cast<unsigned>(b) == 5");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f40,Normal);
      normal = 5;
      local_1548[0].file._0_4_ = 5;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
      Catch::ExprLhs<unsigned_int_const&>::operator==
                ((BinaryExpr<const_unsigned_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<unsigned_int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1c0;
      Catch::StringRef::StringRef(&local_f50,"static_cast<int>(a) == 125");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f50,Normal);
      _normal = (char *)CONCAT44(uStack_1574,0x7d);
      local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0x7d);
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,(int *)local_1548);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1c2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&catchAssertionHandler,"i/o",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&in,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&catchAssertionHandler);
    Catch::Section::Section(&local_1790,(SectionInfo *)&in);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&in);
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    bVar1 = Catch::Section::operator_cast_to_bool(&local_1790);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&catchAssertionHandler);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&catchAssertionHandler_242,"10",(allocator<char> *)&normal);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&in,(string *)&catchAssertionHandler_242,_S_in);
      std::__cxx11::string::~string((string *)&catchAssertionHandler_242);
      i.value_ = 0;
      std::ostream::operator<<(&catchAssertionHandler,0);
      _normal = "REQUIRE";
      local_1570 = 7;
      local_1548[0].file =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      local_1548[0].line = 0x1c9;
      Catch::StringRef::StringRef(&local_f60,"out.str() == \"0\"");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler_242,(StringRef *)&normal,local_1548,local_f60,Normal);
      std::__cxx11::stringbuf::str();
      local_1520 = local_1548;
      Catch::ExprLhs<std::__cxx11::string_const&>::operator==
                ((BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[2]>
                  *)&normal,(ExprLhs<std::__cxx11::string_const&> *)&local_1520,
                 (char (*) [2])0x1cbb8d);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler_242,(ITransientExpression *)&normal);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&normal);
      std::__cxx11::string::~string((string *)local_1548);
      Catch::AssertionHandler::complete(&catchAssertionHandler_242);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_242);
      type_safe::operator>>((basic_istream<char,_std::char_traits<char>_> *)&in,&i);
      _normal = "REQUIRE";
      local_1570 = 7;
      local_1548[0].file =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      local_1548[0].line = 0x1cc;
      Catch::StringRef::StringRef(&local_f70,"static_cast<int>(i) == 10");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler_242,(StringRef *)&normal,local_1548,local_f70,Normal);
      local_1548[0].file = (char *)&local_1520;
      local_1520 = (SourceLineInfo *)CONCAT44(local_1520._4_4_,i.value_);
      local_1514 = 10;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&normal,(ExprLhs<int_const&> *)local_1548,
                 &local_1514);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler_242,(ITransientExpression *)&normal);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&normal);
      Catch::AssertionHandler::complete(&catchAssertionHandler_242);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_242);
      std::__cxx11::istringstream::~istringstream((istringstream *)&in);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&catchAssertionHandler);
    }
    Catch::Section::~Section(&local_1790);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ce;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"abs",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1d2;
      Catch::StringRef::StringRef(&local_f80,"static_cast<unsigned>(ia) == 123u");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f80,Normal);
      normal = 0x7b;
      local_1548[0].file._0_4_ = 0x7b;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
      Catch::ExprLhs<unsigned_int_const&>::operator==
                ((BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> *)&local_1790,
                 (ExprLhs<unsigned_int_const&> *)&catchAssertionHandler_242,(uint *)local_1548);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1d6;
      Catch::StringRef::StringRef(&local_f90,"static_cast<unsigned>(ia) == 123u");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_f90,Normal);
      _normal = (char *)CONCAT44(uStack_1574,0x7b);
      local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0x7b);
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)&normal;
      Catch::ExprLhs<unsigned_int_const&>::operator==
                ((BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> *)&local_1790,
                 (ExprLhs<unsigned_int_const&> *)&catchAssertionHandler_242,(uint *)local_1548);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1d8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"signed_to_unsigned",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1db;
      Catch::StringRef::StringRef
                (&local_fa0,"!std::is_convertible<integer<int8_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_fa0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1dc;
      Catch::StringRef::StringRef
                (&local_fb0,"!std::is_convertible<integer<int8_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_fb0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1dd;
      Catch::StringRef::StringRef
                (&local_fc0,"!std::is_convertible<integer<int8_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_fc0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1de;
      Catch::StringRef::StringRef
                (&local_fd0,"!std::is_convertible<integer<int8_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_fd0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e1;
      Catch::StringRef::StringRef
                (&local_fe0,"!std::is_convertible<integer<int16_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_fe0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e2;
      Catch::StringRef::StringRef
                (&local_ff0,"!std::is_convertible<integer<int16_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_ff0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e3;
      Catch::StringRef::StringRef
                (&local_1000,"!std::is_convertible<integer<int16_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1000,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e4;
      Catch::StringRef::StringRef
                (&local_1010,"!std::is_convertible<integer<int16_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1010,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e7;
      Catch::StringRef::StringRef
                (&local_1020,"!std::is_convertible<integer<int32_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1020,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e8;
      Catch::StringRef::StringRef
                (&local_1030,"!std::is_convertible<integer<int32_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1030,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1e9;
      Catch::StringRef::StringRef
                (&local_1040,"!std::is_convertible<integer<int32_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1040,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ea;
      Catch::StringRef::StringRef
                (&local_1050,"!std::is_convertible<integer<int32_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1050,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ed;
      Catch::StringRef::StringRef
                (&local_1060,"!std::is_convertible<integer<int64_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1060,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ee;
      Catch::StringRef::StringRef
                (&local_1070,"!std::is_convertible<integer<int64_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1070,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1ef;
      Catch::StringRef::StringRef
                (&local_1080,"!std::is_convertible<integer<int64_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1080,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1f0;
      Catch::StringRef::StringRef
                (&local_1090,"!std::is_convertible<integer<int64_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1090,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1f2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"unsigned_to_signed",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1f5;
      Catch::StringRef::StringRef
                (&local_10a0,"!std::is_convertible<integer<uint8_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_10a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1f6;
      Catch::StringRef::StringRef
                (&local_10b0,"std::is_convertible<integer<uint8_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_10b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1f7;
      Catch::StringRef::StringRef
                (&local_10c0,"std::is_convertible<integer<uint8_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_10c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1f8;
      Catch::StringRef::StringRef
                (&local_10d0,"std::is_convertible<integer<uint8_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_10d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1fb;
      Catch::StringRef::StringRef
                (&local_10e0,"!std::is_convertible<integer<uint16_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_10e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1fc;
      Catch::StringRef::StringRef
                (&local_10f0,"!std::is_convertible<integer<uint16_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_10f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1fd;
      Catch::StringRef::StringRef
                (&local_1100,"std::is_convertible<integer<uint16_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1100,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x1fe;
      Catch::StringRef::StringRef
                (&local_1110,"std::is_convertible<integer<uint16_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1110,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x201;
      Catch::StringRef::StringRef
                (&local_1120,"!std::is_convertible<integer<uint32_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1120,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x202;
      Catch::StringRef::StringRef
                (&local_1130,"!std::is_convertible<integer<uint32_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1130,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x203;
      Catch::StringRef::StringRef
                (&local_1140,"!std::is_convertible<integer<uint32_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1140,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x204;
      Catch::StringRef::StringRef
                (&local_1150,"std::is_convertible<integer<uint32_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1150,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x207;
      Catch::StringRef::StringRef
                (&local_1160,"!std::is_convertible<integer<uint64_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1160,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x208;
      Catch::StringRef::StringRef
                (&local_1170,"!std::is_convertible<integer<uint64_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1170,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x209;
      Catch::StringRef::StringRef
                (&local_1180,"!std::is_convertible<integer<uint64_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1180,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x20a;
      Catch::StringRef::StringRef
                (&local_1190,"!std::is_convertible<integer<uint64_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1190,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x20c;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"signed_to_signed",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x20f;
      Catch::StringRef::StringRef
                (&local_11a0,"std::is_convertible<integer<int8_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_11a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x210;
      Catch::StringRef::StringRef
                (&local_11b0,"std::is_convertible<integer<int8_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_11b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x211;
      Catch::StringRef::StringRef
                (&local_11c0,"std::is_convertible<integer<int8_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_11c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x212;
      Catch::StringRef::StringRef
                (&local_11d0,"std::is_convertible<integer<int8_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_11d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x215;
      Catch::StringRef::StringRef
                (&local_11e0,"!std::is_convertible<integer<int16_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_11e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x216;
      Catch::StringRef::StringRef
                (&local_11f0,"std::is_convertible<integer<int16_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_11f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x217;
      Catch::StringRef::StringRef
                (&local_1200,"std::is_convertible<integer<int16_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1200,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x218;
      Catch::StringRef::StringRef
                (&local_1210,"std::is_convertible<integer<int16_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1210,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x21b;
      Catch::StringRef::StringRef
                (&local_1220,"!std::is_convertible<integer<int32_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1220,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x21c;
      Catch::StringRef::StringRef
                (&local_1230,"!std::is_convertible<integer<int32_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1230,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x21d;
      Catch::StringRef::StringRef
                (&local_1240,"std::is_convertible<integer<int32_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1240,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x21e;
      Catch::StringRef::StringRef
                (&local_1250,"std::is_convertible<integer<int32_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1250,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x221;
      Catch::StringRef::StringRef
                (&local_1260,"!std::is_convertible<integer<int64_t>, integer<int8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1260,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x222;
      Catch::StringRef::StringRef
                (&local_1270,"!std::is_convertible<integer<int64_t>, integer<int16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1270,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x223;
      Catch::StringRef::StringRef
                (&local_1280,"!std::is_convertible<integer<int64_t>, integer<int32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1280,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x224;
      Catch::StringRef::StringRef
                (&local_1290,"std::is_convertible<integer<int64_t>, integer<int64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1290,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x226;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"unsigned_to_unsigned",(allocator<char> *)&normal);
    Catch::SectionInfo::SectionInfo
              ((SectionInfo *)&catchAssertionHandler,(SourceLineInfo *)&catchAssertionHandler_242,
               (string *)&local_1790);
    Catch::Section::Section((Section *)&in,(SectionInfo *)&catchAssertionHandler);
    Catch::SectionInfo::~SectionInfo((SectionInfo *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1790);
    bVar1 = Catch::Section::operator_cast_to_bool((Section *)&in);
    if (bVar1) {
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x229;
      Catch::StringRef::StringRef
                (&local_12a0,"std::is_convertible<integer<uint8_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_12a0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x22a;
      Catch::StringRef::StringRef
                (&local_12b0,"std::is_convertible<integer<uint8_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_12b0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x22b;
      Catch::StringRef::StringRef
                (&local_12c0,"std::is_convertible<integer<uint8_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_12c0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x22c;
      Catch::StringRef::StringRef
                (&local_12d0,"std::is_convertible<integer<uint8_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_12d0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x22f;
      Catch::StringRef::StringRef
                (&local_12e0,"!std::is_convertible<integer<uint16_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_12e0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x230;
      Catch::StringRef::StringRef
                (&local_12f0,"std::is_convertible<integer<uint16_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_12f0,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x231;
      Catch::StringRef::StringRef
                (&local_1300,"std::is_convertible<integer<uint16_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1300,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x232;
      Catch::StringRef::StringRef
                (&local_1310,"std::is_convertible<integer<uint16_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1310,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x235;
      Catch::StringRef::StringRef
                (&local_1320,"!std::is_convertible<integer<uint32_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1320,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x236;
      Catch::StringRef::StringRef
                (&local_1330,"!std::is_convertible<integer<uint32_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1330,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x237;
      Catch::StringRef::StringRef
                (&local_1340,"std::is_convertible<integer<uint32_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1340,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x238;
      Catch::StringRef::StringRef
                (&local_1350,"std::is_convertible<integer<uint32_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1350,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x23b;
      Catch::StringRef::StringRef
                (&local_1360,"!std::is_convertible<integer<uint64_t>, integer<uint8_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1360,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x23c;
      Catch::StringRef::StringRef
                (&local_1370,"!std::is_convertible<integer<uint64_t>, integer<uint16_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1370,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x23d;
      Catch::StringRef::StringRef
                (&local_1380,"!std::is_convertible<integer<uint64_t>, integer<uint32_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1380,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x23e;
      Catch::StringRef::StringRef
                (&local_1390,"std::is_convertible<integer<uint64_t>, integer<uint64_t>>::value");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1390,Normal);
      local_1790.super_NonCopyable._vptr_NonCopyable._0_1_ = 1;
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1790)
      ;
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    Catch::Section::~Section((Section *)&in);
    return;
  }
  normal = 1;
  local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
  local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
  catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x8d;
  Catch::StringRef::StringRef(&local_1d0,"static_cast<int>(wrapper) == normal");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1790,
             (SourceLineInfo *)&catchAssertionHandler_242,local_1d0,Normal);
  local_1548[0].file._0_4_ = 1;
  catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
  Catch::ExprLhs<int_const&>::operator==
            ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
             (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  bVar1 = type_safe::detail::will_multiplication_error<int>(1,5);
  if (!bVar1) {
    normal = normal * 5;
    local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
    local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp";
    catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x91;
    Catch::StringRef::StringRef(&local_1e0,"static_cast<int>(wrapper) == normal");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_1790,
               (SourceLineInfo *)&catchAssertionHandler_242,local_1e0,Normal);
    local_1548[0].file._0_4_ = 5;
    catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
               (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)&local_1790);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    bVar1 = type_safe::detail::will_multiplication_error<int>(5,5);
    if (!bVar1) {
      normal = normal * 5;
      local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
      local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
      ;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x95;
      Catch::StringRef::StringRef(&local_1f0,"static_cast<int>(wrapper) == normal");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1790,
                 (SourceLineInfo *)&catchAssertionHandler_242,local_1f0,Normal);
      local_1548[0].file._0_4_ = 0x19;
      catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                 (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,(ITransientExpression *)&local_1790);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      bVar1 = type_safe::detail::will_multiplication_error<int>(0x19,0xffffffffffffffe9);
      if (!bVar1) {
        normal = normal * -0x17;
        local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
        local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
        catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
        ;
        catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x99;
        Catch::StringRef::StringRef(&local_200,"static_cast<int>(wrapper) == normal");
        Catch::AssertionHandler::AssertionHandler
                  (&catchAssertionHandler,(StringRef *)&local_1790,
                   (SourceLineInfo *)&catchAssertionHandler_242,local_200,Normal);
        local_1548[0].file._0_4_ = 0xfffffdc1;
        catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
        Catch::ExprLhs<int_const&>::operator==
                  ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                   (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
        Catch::AssertionHandler::handleExpr
                  (&catchAssertionHandler,(ITransientExpression *)&local_1790);
        Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
        Catch::AssertionHandler::complete(&catchAssertionHandler);
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
        bVar1 = type_safe::detail::will_multiplication_error<int>(0x16,0xfffffdc1);
        if (!bVar1) {
          normal = normal * 0x16;
          local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
          local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
          catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
          ;
          catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0x9d;
          Catch::StringRef::StringRef(&local_210,"static_cast<int>(wrapper) == normal");
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,(StringRef *)&local_1790,
                     (SourceLineInfo *)&catchAssertionHandler_242,local_210,Normal);
          local_1548[0].file._0_4_ = 0xffffce96;
          catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
          Catch::ExprLhs<int_const&>::operator==
                    ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                     (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
          Catch::AssertionHandler::handleExpr
                    (&catchAssertionHandler,(ITransientExpression *)&local_1790);
          Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
          Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
          bVar1 = type_safe::detail::will_multiplication_error<int>(0xfffffffffffffffc,0xffffce96);
          if (!bVar1) {
            _normal = (char *)CONCAT44(uStack_1574,normal * -4);
            local_1790.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x1c48db;
            local_1790.m_info.name._M_dataplus._M_p = (pointer)0x7;
            catchAssertionHandler_242.m_assertionInfo.macroName.m_start =
                 "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/integer.cpp"
            ;
            catchAssertionHandler_242.m_assertionInfo.macroName.m_size = 0xa1;
            Catch::StringRef::StringRef(&local_220,"static_cast<int>(wrapper) == normal");
            Catch::AssertionHandler::AssertionHandler
                      (&catchAssertionHandler,(StringRef *)&local_1790,
                       (SourceLineInfo *)&catchAssertionHandler_242,local_220,Normal);
            local_1548[0].file = (char *)CONCAT44(local_1548[0].file._4_4_,0xc5a8);
            catchAssertionHandler_242.m_assertionInfo.macroName.m_start = (char *)local_1548;
            Catch::ExprLhs<int_const&>::operator==
                      ((BinaryExpr<const_int_&,_const_int_&> *)&local_1790,
                       (ExprLhs<int_const&> *)&catchAssertionHandler_242,&normal);
            Catch::AssertionHandler::handleExpr
                      (&catchAssertionHandler,(ITransientExpression *)&local_1790);
            Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_1790);
            Catch::AssertionHandler::complete(&catchAssertionHandler);
            Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
            goto LAB_0016ec47;
          }
        }
      }
    }
  }
  pAVar2 = &catchAssertionHandler;
LAB_0017846b:
  do {
    (pAVar2->m_assertionInfo).macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    *(undefined4 *)&(pAVar2->m_assertionInfo).macroName.m_size = 0xa3;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[39]>
              (debug_assert::detail::always_false,pAVar2,"","multiplication will result in overflow"
              );
    pAVar2 = &catchAssertionHandler_242;
  } while( true );
}

Assistant:

virtual ~base() = default;